

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

int __thiscall
lzham::lzcompressor::enumerate_lz_decisions
          (lzcompressor *this,uint ofs,state *cur_state,
          vector<lzham::lzcompressor::lzpriced_decision> *decisions,uint min_match_len,
          uint max_match_len)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint pos;
  bit_cost_t bVar5;
  lzdecision *plVar6;
  vector<lzham::lzcompressor::lzpriced_decision> *in_RCX;
  uint in_ESI;
  long in_RDI;
  uint in_R8D;
  uint in_R9D;
  lzpriced_decision dec_1;
  uint match_len;
  dict_match *pMatches;
  lzpriced_decision dec;
  uint hist_match_len;
  uint i;
  uint match_hist_max_len;
  lzpriced_decision *lit_dec;
  bit_cost_t largest_cost;
  uint largest_len;
  uint largest_index;
  uint lookahead_ofs;
  uint start_ofs;
  int in_stack_ffffffffffffff38;
  uint len;
  int in_stack_ffffffffffffff3c;
  lzpriced_decision *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  bit_cost_t in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  uint uVar7;
  dict_match *local_80;
  lzdecision *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  uint uVar8;
  undefined4 in_stack_ffffffffffffffac;
  uint a;
  state *in_stack_ffffffffffffffb0;
  lzdecision *local_48;
  uint local_40;
  int local_3c;
  
  uVar2 = search_accelerator::get_lookahead_pos((search_accelerator *)(in_RDI + 0x78));
  uVar3 = search_accelerator::get_max_dict_size_mask((search_accelerator *)(in_RDI + 0x78));
  uVar4 = uVar2 & uVar3;
  local_3c = 0;
  bVar1 = SUB81((ulong)in_stack_ffffffffffffff40 >> 0x18,0);
  uVar3 = (uint)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  if (in_R8D < 2) {
    bVar1 = vector<lzham::lzcompressor::lzpriced_decision>::try_resize
                      ((vector<lzham::lzcompressor::lzpriced_decision> *)
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),uVar3,bVar1);
    if (!bVar1) {
      return -1;
    }
    in_stack_ffffffffffffffb0 =
         (state *)vector<lzham::lzcompressor::lzpriced_decision>::operator[](in_RCX,0);
    lzpriced_decision::init
              ((lzpriced_decision *)in_stack_ffffffffffffffb0,(EVP_PKEY_CTX *)(ulong)in_ESI);
    bVar5 = state::get_cost(in_stack_ffffffffffffffb0,
                            (CLZBase *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                            ,(search_accelerator *)
                             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff98);
    *(bit_cost_t *)((in_stack_ffffffffffffffb0->super_state_base).m_match_hist + 2) = bVar5;
    local_48 = *(lzdecision **)((in_stack_ffffffffffffffb0->super_state_base).m_match_hist + 2);
    local_40 = 1;
  }
  else {
    bVar1 = vector<lzham::lzcompressor::lzpriced_decision>::try_resize
                      ((vector<lzham::lzcompressor::lzpriced_decision> *)
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),uVar3,bVar1);
    if (!bVar1) {
      return -1;
    }
    local_40 = 0;
    local_48 = (lzdecision *)0xffffffffffffffff;
  }
  a = 0;
  for (uVar8 = 0; uVar8 < 4; uVar8 = uVar8 + 1) {
    in_stack_ffffffffffffffa4 =
         search_accelerator::get_match_len
                   ((search_accelerator *)
                    CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                    (uint)(in_stack_ffffffffffffff70 >> 0x20),(int)in_stack_ffffffffffffff70,
                    in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    if ((in_R8D <= in_stack_ffffffffffffffa4) &&
       (((in_stack_ffffffffffffffa4 == 1 && (uVar8 == 0)) || (1 < in_stack_ffffffffffffffa4)))) {
      a = math::maximum<unsigned_int>(a,in_stack_ffffffffffffffa4);
      lzpriced_decision::lzpriced_decision
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,0);
      in_stack_ffffffffffffff98 =
           (lzdecision *)
           state::get_cost(in_stack_ffffffffffffffb0,(CLZBase *)CONCAT44(a,uVar8),
                           (search_accelerator *)
                           CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           in_stack_ffffffffffffff98);
      bVar1 = vector<lzham::lzcompressor::lzpriced_decision>::try_push_back
                        ((vector<lzham::lzcompressor::lzpriced_decision> *)
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                         in_stack_ffffffffffffff40);
      if (!bVar1) {
        return -1;
      }
      if ((local_40 < in_stack_ffffffffffffffa4) ||
         ((in_stack_ffffffffffffffa4 == local_40 && (in_stack_ffffffffffffff98 < local_48)))) {
        uVar3 = vector<lzham::lzcompressor::lzpriced_decision>::size(in_RCX);
        local_3c = uVar3 - 1;
        local_48 = in_stack_ffffffffffffff98;
        local_40 = in_stack_ffffffffffffffa4;
      }
    }
  }
  if (((1 < in_R9D) && (a < *(uint *)(in_RDI + 0x43e8))) &&
     (local_80 = search_accelerator::find_matches
                           ((search_accelerator *)CONCAT44(uVar2,in_stack_ffffffffffffff58),
                            (uint)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0)),
     local_80 != (dict_match *)0x0)) {
    while( true ) {
      uVar2 = dict_match::get_len(local_80);
      pos = math::minimum<unsigned_int>(uVar2,in_R9D);
      if ((in_R8D <= pos) && (a < pos)) {
        if ((0x101 < in_R9D) && (pos == 0x101)) {
          in_stack_ffffffffffffff40 = (lzpriced_decision *)(in_RDI + 0x78);
          in_stack_ffffffffffffff4c = in_ESI - uVar4;
          dict_match::get_dist(local_80);
          pos = search_accelerator::get_match_len
                          ((search_accelerator *)CONCAT44(pos,in_stack_ffffffffffffff78),
                           (uint)(in_stack_ffffffffffffff70 >> 0x20),(int)in_stack_ffffffffffffff70,
                           in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
        }
        len = in_ESI;
        uVar7 = pos;
        dict_match::get_dist(local_80);
        lzpriced_decision::lzpriced_decision(in_stack_ffffffffffffff40,pos,len,0);
        in_stack_ffffffffffffff70 =
             state::get_cost(in_stack_ffffffffffffffb0,(CLZBase *)CONCAT44(a,uVar8),
                             (search_accelerator *)
                             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                             in_stack_ffffffffffffff98);
        bVar1 = vector<lzham::lzcompressor::lzpriced_decision>::try_push_back
                          ((vector<lzham::lzcompressor::lzpriced_decision> *)
                           CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                           in_stack_ffffffffffffff40);
        if (!bVar1) {
          return -1;
        }
        if ((local_40 < uVar7) ||
           ((uVar7 == local_40 &&
            (plVar6 = (lzdecision *)
                      lzpriced_decision::get_cost((lzpriced_decision *)&stack0xffffffffffffff60),
            plVar6 < local_48)))) {
          uVar2 = vector<lzham::lzcompressor::lzpriced_decision>::size(in_RCX);
          local_3c = uVar2 - 1;
          local_48 = (lzdecision *)
                     lzpriced_decision::get_cost((lzpriced_decision *)&stack0xffffffffffffff60);
          local_40 = uVar7;
        }
      }
      bVar1 = dict_match::is_last(local_80);
      if (bVar1) break;
      local_80 = local_80 + 1;
    }
  }
  return local_3c;
}

Assistant:

int lzcompressor::enumerate_lz_decisions(uint ofs, const state& cur_state, lzham::vector<lzpriced_decision>& decisions, uint min_match_len, uint max_match_len)
   {
      LZHAM_ASSERT(min_match_len >= 1);

      uint start_ofs = m_accel.get_lookahead_pos() & m_accel.get_max_dict_size_mask();
      LZHAM_ASSERT(ofs >= start_ofs);
      const uint lookahead_ofs = ofs - start_ofs;

      uint largest_index = 0;
      uint largest_len;
      bit_cost_t largest_cost;

      if (min_match_len <= 1)
      {
         if (!decisions.try_resize(1))
         {
            LZHAM_LOG_ERROR(7038);
            return -1;
         }

         lzpriced_decision& lit_dec = decisions[0];
         lit_dec.init(ofs, 0, 0, 0);
         lit_dec.m_cost = cur_state.get_cost(*this, m_accel, lit_dec);
         largest_cost = lit_dec.m_cost;

         largest_len = 1;
      }
      else
      {
         if (!decisions.try_resize(0))
         {
            LZHAM_LOG_ERROR(7039);
            return -1;
         }

         largest_len = 0;
         largest_cost = cBitCostMax;
      }

      uint match_hist_max_len = 0;

      // Add rep matches.
      for (uint i = 0; i < cMatchHistSize; i++)
      {
         uint hist_match_len = m_accel.get_match_len(lookahead_ofs, cur_state.m_match_hist[i], max_match_len);
         if (hist_match_len < min_match_len)
            continue;

         if ( ((hist_match_len == 1) && (i == 0)) || (hist_match_len >= CLZBase::cMinMatchLen) )
         {
            match_hist_max_len = math::maximum(match_hist_max_len, hist_match_len);

            lzpriced_decision dec(ofs, hist_match_len, -((int)i + 1));
            dec.m_cost = cur_state.get_cost(*this, m_accel, dec);

            if (!decisions.try_push_back(dec))
            {
               LZHAM_LOG_ERROR(7040);
               return -1;
            }

            if ( (hist_match_len > largest_len) || ((hist_match_len == largest_len) && (dec.m_cost < largest_cost)) )
            {
               largest_index = decisions.size() - 1;
               largest_len = hist_match_len;
               largest_cost = dec.m_cost;
            }
         }
      }

      // Now add full matches.
      if ((max_match_len >= CLZBase::cMinMatchLen) && (match_hist_max_len < m_fast_bytes))
      {
         const dict_match* pMatches = m_accel.find_matches(lookahead_ofs);

         if (pMatches)
         {
            for ( ; ; )
            {
               uint match_len = math::minimum(pMatches->get_len(), max_match_len);
               LZHAM_ASSERT((pMatches->get_dist() > 0) && (pMatches->get_dist() <= m_dict_size));

               // Full matches are very likely to be more expensive than rep matches of the same length, so don't bother evaluating them.
               if ((match_len >= min_match_len) && (match_len > match_hist_max_len))
               {
                  if ((max_match_len > CLZBase::cMaxMatchLen) && (match_len == CLZBase::cMaxMatchLen))
                  {
                     match_len = m_accel.get_match_len(lookahead_ofs, pMatches->get_dist(), max_match_len, CLZBase::cMaxMatchLen);
                  }

                  lzpriced_decision dec(ofs, match_len, pMatches->get_dist());
                  dec.m_cost = cur_state.get_cost(*this, m_accel, dec);

                  if (!decisions.try_push_back(dec))
                  {
                     LZHAM_LOG_ERROR(7041);
                     return -1;
                  }

                  if ( (match_len > largest_len) || ((match_len == largest_len) && (dec.get_cost() < largest_cost)) )
                  {
                     largest_index = decisions.size() - 1;
                     largest_len = match_len;
                     largest_cost = dec.get_cost();
                  }
               }
               if (pMatches->is_last())
                  break;
               pMatches++;
            }
         }
      }

      return largest_index;
   }